

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O0

shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __thiscall
Storage::Tape::ZX8081::Parser::get_next_file_data
          (Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  bool bVar1;
  element_type *this_00;
  shared_ptr<Storage::Tape::Tape> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> sVar3;
  byte local_61;
  value_type_conflict3 local_41 [21];
  int local_2c;
  undefined1 local_25;
  int byte;
  shared_ptr<Storage::Tape::Tape> *psStack_20;
  SymbolType symbol;
  shared_ptr<Storage::Tape::Tape> *tape_local;
  Parser *this_local;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *result;
  
  psStack_20 = in_RDX;
  tape_local = tape;
  this_local = this;
  bVar1 = Parser<Storage::Tape::ZX8081::SymbolType>::is_at_end
                    ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,in_RDX);
  if (bVar1) {
    std::shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)this,
               (nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    byte = Parser<Storage::Tape::ZX8081::SymbolType>::get_next_symbol
                     ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,psStack_20);
    if (byte == FileGap) {
      byte = 2;
      while( true ) {
        if ((byte == 2) || (local_61 = 0, byte == 3)) {
          bVar1 = Parser<Storage::Tape::ZX8081::SymbolType>::is_at_end
                            ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,psStack_20);
          local_61 = bVar1 ^ 0xff;
        }
        if ((local_61 & 1) == 0) break;
        byte = Parser<Storage::Tape::ZX8081::SymbolType>::get_next_symbol
                         ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,psStack_20);
      }
      bVar1 = Parser<Storage::Tape::ZX8081::SymbolType>::is_at_end
                        ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,psStack_20);
      if (bVar1) {
        std::shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::shared_ptr
                  ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)this,
                   (nullptr_t)0x0);
        _Var2._M_pi = extraout_RDX_01;
      }
      else {
        Parser<Storage::Tape::ZX8081::SymbolType>::return_symbol
                  ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,byte);
        local_25 = 0;
        std::make_shared<std::vector<unsigned_char,std::allocator<unsigned_char>>>();
        while ((bVar1 = Parser<Storage::Tape::ZX8081::SymbolType>::is_at_end
                                  ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,psStack_20),
               _Var2._M_pi = extraout_RDX_02, ((bVar1 ^ 0xffU) & 1) != 0 &&
               (local_2c = get_next_byte((Parser *)tape,psStack_20), _Var2._M_pi = extraout_RDX_03,
               local_2c != -1))) {
          this_00 = std::
                    __shared_ptr_access<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          local_41[0] = (value_type_conflict3)local_2c;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this_00,local_41);
        }
      }
    }
    else {
      std::shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::shared_ptr
                ((shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)this,
                 (nullptr_t)0x0);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  sVar3.
  super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  sVar3.
  super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         sVar3.
         super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<std::vector<uint8_t>> Parser::get_next_file_data(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	if(is_at_end(tape)) return nullptr;
	SymbolType symbol = get_next_symbol(tape);
	if(symbol != SymbolType::FileGap) {
		return nullptr;
	}
	while((symbol == SymbolType::FileGap || symbol == SymbolType::Unrecognised) && !is_at_end(tape)) {
		symbol = get_next_symbol(tape);
	}
	if(is_at_end(tape)) return nullptr;
	return_symbol(symbol);

	auto result = std::make_shared<std::vector<uint8_t>>();
	int byte;
	while(!is_at_end(tape)) {
		byte = get_next_byte(tape);
		if(byte == -1) return result;
		result->push_back(uint8_t(byte));
	}
	return result;
}